

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AList.hpp
# Opt level: O0

ostream * operator<<(ostream *stream,ItemInfo *ref)

{
  ItemInfo *this;
  _ItemValueType _Var1;
  _ItemValueInfo local_b8;
  _ItemValueInfo local_98;
  _ItemValueInfo local_78;
  _ItemValueInfo local_58;
  _ItemValueInfo local_38;
  ItemInfo *local_18;
  ItemInfo *ref_local;
  ostream *stream_local;
  
  local_18 = ref;
  ref_local = (ItemInfo *)stream;
  _Var1 = ItemInfo::get_type(ref);
  this = ref_local;
  switch(_Var1) {
  case IVT_BOOL:
    ItemInfo::get_value(&local_38,local_18);
    std::ostream::operator<<(this,(bool)(local_38.field_3.bValue & 1));
    break;
  case IVT_INT:
    ItemInfo::get_value(&local_58,local_18);
    std::ostream::operator<<(this,local_58.field_3.iValue);
    break;
  case IVT_FLOAT:
    ItemInfo::get_value(&local_78,local_18);
    std::ostream::operator<<(this,local_78.field_3.fValue);
    break;
  case IVT_DOUBLE:
    ItemInfo::get_value(&local_98,local_18);
    std::ostream::operator<<(this,local_98.field_3.eValue);
    break;
  case IVT_STRING:
    ItemInfo::get_value(&local_b8,local_18);
    std::operator<<((ostream *)this,local_b8.field_3.sValue);
    break;
  case IVT_LIST:
    std::operator<<((ostream *)ref_local,"[List]");
    break;
  case IVT_OBJECT:
    std::operator<<((ostream *)ref_local,"[Object]");
  }
  return (ostream *)ref_local;
}

Assistant:

inline ostream& operator << (ostream &stream, ItemInfo& ref)
        {
            switch (ref.get_type())
            {
                case IVT_BOOL:
                {
                    stream << ref.get_value().bValue;
                }
                break;

                case IVT_INT:
                {
                    stream << ref.get_value().iValue;
                }
                break;

                case IVT_FLOAT:
                {
                    stream << ref.get_value().fValue;
                }
                break;

                case IVT_DOUBLE:
                {
                    stream << ref.get_value().eValue;
                }
                break;

                case IVT_STRING:
                {
                    stream << ref.get_value().sValue;
                }
                break;

                case IVT_LIST:
                {
                    stream << "[List]";
                }
                break;

                case IVT_OBJECT:
                {
                    stream << "[Object]";
                }
                break;

                default:
                {
                }
                break;
            }

            return stream;
        }